

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.h
# Opt level: O2

void __thiscall
Jinx::Impl::Script::ExecutionFrame::ExecutionFrame(ExecutionFrame *this,BufferPtr *b,char *n)

{
  __shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             &b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&b->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  BinaryReader::BinaryReader(&this->reader,(BufferPtr *)&_Stack_38);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_38._M_refcount);
  this->name = n;
  this->stackTop = 0;
  this->onReturn = Continue;
  return;
}

Assistant:

ExecutionFrame(BufferPtr b, const char * n) : bytecode(b), reader(b), name(n) {}